

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCodabarReader.cpp
# Opt level: O0

Barcode * __thiscall
ZXing::OneD::CodabarReader::decodePattern
          (CodabarReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_4)

{
  bool bVar1;
  char cVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  int iVar5;
  char *pcVar6;
  undefined8 *in_RCX;
  long in_RSI;
  Barcode *in_RDI;
  int xStop;
  SymbologyIdentifier symbologyIdentifier;
  string txt;
  int maxInterCharacterSpace;
  int xStart;
  anon_class_1_0_00000001 isStartOrStopSymbol;
  int minCharCount;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  Error *in_stack_fffffffffffffe40;
  float in_stack_fffffffffffffe4c;
  PatternView *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  Result *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  undefined6 in_stack_fffffffffffffed0;
  SymbologyIdentifier si;
  undefined8 in_stack_fffffffffffffee0;
  Error *in_stack_fffffffffffffee8;
  string local_a8 [32];
  undefined4 local_88;
  string local_78 [32];
  int local_58;
  int local_54;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  anon_class_1_0_00000001 local_2d;
  undefined4 local_2c;
  undefined8 *local_20;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  local_2c = 4;
  local_20 = in_RCX;
  FindLeftGuard<7,bool(*)(ZXing::PatternView_const&,int)>
            ((PatternView *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe8c,(_func_bool_PatternView_ptr_int *)in_stack_fffffffffffffe80);
  *local_20 = local_50;
  local_20[1] = local_48;
  local_20[2] = local_40;
  local_20[3] = local_38;
  bVar1 = PatternView::isValid((PatternView *)in_stack_fffffffffffffe40);
  if (bVar1) {
    local_54 = PatternView::pixelsInFront((PatternView *)in_stack_fffffffffffffe40);
    local_58 = PatternView::sum((PatternView *)
                                CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),iVar5)
    ;
    local_58 = local_58 / 2;
    std::__cxx11::string::string(local_78);
    std::__cxx11::string::reserve((ulong)local_78);
    cVar2 = OneD::RowReader::DecodeNarrowWidePattern<int[20],char[21]>
                      ((PatternView *)in_stack_fffffffffffffe40,
                       (int (*) [20])CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       (char (*) [21])0x289082);
    std::__cxx11::string::operator+=(local_78,cVar2);
    pcVar6 = (char *)std::__cxx11::string::back();
    bVar1 = decodePattern::anon_class_1_0_00000001::operator()(&local_2d,*pcVar6);
    if (bVar1) {
      do {
        uVar3 = PatternView::skipSymbol((PatternView *)0x28917a);
        if ((!(bool)uVar3) ||
           (uVar4 = PatternView::skipSingle
                              ((PatternView *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c),
           !(bool)uVar4)) {
          in_RDI->_format = None;
          in_RDI->_ecLevel[0] = '\0';
          in_RDI->_ecLevel[1] = '\0';
          in_RDI->_ecLevel[2] = '\0';
          in_RDI->_ecLevel[3] = '\0';
          in_RDI->_version[0] = '\0';
          in_RDI->_version[1] = '\0';
          in_RDI->_version[2] = '\0';
          in_RDI->_version[3] = '\0';
          in_RDI->_lineCount = 0;
          (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
          *(undefined8 *)&(in_RDI->_sai).id = 0;
          (in_RDI->_sai).id._M_string_length = 0;
          *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
          (in_RDI->_sai).index = 0;
          (in_RDI->_sai).count = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
          *(undefined8 *)&in_RDI->_readerOpts = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
          (in_RDI->_error)._line = 0;
          (in_RDI->_error)._type = None;
          *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
          *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
          (in_RDI->_error)._file = (char *)0x0;
          (in_RDI->_error)._msg._M_string_length = 0;
          (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
          (in_RDI->_content).symbology.code = '\0';
          (in_RDI->_content).symbology.modifier = '\0';
          (in_RDI->_content).symbology.eciModifierOffset = '\0';
          (in_RDI->_content).symbology.aiFlag = None;
          (in_RDI->_content).defaultCharset = Unknown;
          (in_RDI->_content).hasECI = false;
          *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
          *(undefined8 *)&(in_RDI->_error)._msg = 0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          in_RDI->_isMirrored = false;
          in_RDI->_isInverted = false;
          in_RDI->_readerInit = false;
          *(undefined5 *)&in_RDI->field_0xd3 = 0;
          Result::Result(in_stack_fffffffffffffe80);
          goto LAB_0028955f;
        }
        cVar2 = OneD::RowReader::DecodeNarrowWidePattern<int[20],char[21]>
                          ((PatternView *)in_stack_fffffffffffffe40,
                           (int (*) [20])
                           CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                           (char (*) [21])0x28924c);
        std::__cxx11::string::operator+=(local_78,cVar2);
        pcVar6 = (char *)std::__cxx11::string::back();
        if (*pcVar6 == '\0') {
          in_RDI->_format = None;
          in_RDI->_ecLevel[0] = '\0';
          in_RDI->_ecLevel[1] = '\0';
          in_RDI->_ecLevel[2] = '\0';
          in_RDI->_ecLevel[3] = '\0';
          in_RDI->_version[0] = '\0';
          in_RDI->_version[1] = '\0';
          in_RDI->_version[2] = '\0';
          in_RDI->_version[3] = '\0';
          in_RDI->_lineCount = 0;
          (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
          *(undefined8 *)&(in_RDI->_sai).id = 0;
          (in_RDI->_sai).id._M_string_length = 0;
          *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
          (in_RDI->_sai).index = 0;
          (in_RDI->_sai).count = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
          *(undefined8 *)&in_RDI->_readerOpts = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
          (in_RDI->_error)._line = 0;
          (in_RDI->_error)._type = None;
          *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
          *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
          (in_RDI->_error)._file = (char *)0x0;
          (in_RDI->_error)._msg._M_string_length = 0;
          (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
          (in_RDI->_content).symbology.code = '\0';
          (in_RDI->_content).symbology.modifier = '\0';
          (in_RDI->_content).symbology.eciModifierOffset = '\0';
          (in_RDI->_content).symbology.aiFlag = None;
          (in_RDI->_content).defaultCharset = Unknown;
          (in_RDI->_content).hasECI = false;
          *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
          *(undefined8 *)&(in_RDI->_error)._msg = 0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          in_RDI->_isMirrored = false;
          in_RDI->_isInverted = false;
          in_RDI->_readerInit = false;
          *(undefined5 *)&in_RDI->field_0xd3 = 0;
          Result::Result(in_stack_fffffffffffffe80);
          goto LAB_0028955f;
        }
        pcVar6 = (char *)std::__cxx11::string::back();
        bVar1 = decodePattern::anon_class_1_0_00000001::operator()(&local_2d,*pcVar6);
        si = SUB84(in_stack_fffffffffffffee0,0);
      } while (((bVar1 ^ 0xffU) & 1) != 0);
      iVar5 = Size<std::__cxx11::string>(&in_stack_fffffffffffffe40->_msg);
      if ((iVar5 < 4) ||
         (bVar1 = PatternView::hasQuietZoneAfter<true>
                            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c), !bVar1)) {
        in_RDI->_format = None;
        in_RDI->_ecLevel[0] = '\0';
        in_RDI->_ecLevel[1] = '\0';
        in_RDI->_ecLevel[2] = '\0';
        in_RDI->_ecLevel[3] = '\0';
        in_RDI->_version[0] = '\0';
        in_RDI->_version[1] = '\0';
        in_RDI->_version[2] = '\0';
        in_RDI->_version[3] = '\0';
        in_RDI->_lineCount = 0;
        (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
        *(undefined8 *)&(in_RDI->_sai).id = 0;
        (in_RDI->_sai).id._M_string_length = 0;
        *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
        (in_RDI->_sai).index = 0;
        (in_RDI->_sai).count = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
        *(undefined8 *)&in_RDI->_readerOpts = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
        (in_RDI->_error)._line = 0;
        (in_RDI->_error)._type = None;
        *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
        *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
        (in_RDI->_error)._file = (char *)0x0;
        (in_RDI->_error)._msg._M_string_length = 0;
        (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
        (in_RDI->_content).symbology.code = '\0';
        (in_RDI->_content).symbology.modifier = '\0';
        (in_RDI->_content).symbology.eciModifierOffset = '\0';
        (in_RDI->_content).symbology.aiFlag = None;
        (in_RDI->_content).defaultCharset = Unknown;
        (in_RDI->_content).hasECI = false;
        *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
        *(undefined8 *)&(in_RDI->_error)._msg = 0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        in_RDI->_isMirrored = false;
        in_RDI->_isInverted = false;
        in_RDI->_readerInit = false;
        *(undefined5 *)&in_RDI->field_0xd3 = 0;
        Result::Result((Result *)0x0);
      }
      else {
        bVar1 = ReaderOptions::returnCodabarStartEnd(*(ReaderOptions **)(in_RSI + 8));
        if (!bVar1) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_a8,(ulong)local_78);
          std::__cxx11::string::operator=(local_78,local_a8);
          std::__cxx11::string::~string(local_a8);
        }
        PatternView::pixelsTillEnd((PatternView *)in_stack_fffffffffffffe40);
        Error::Error(in_stack_fffffffffffffe40);
        Result::Result((Result *)CONCAT17(uVar3,CONCAT16(uVar4,in_stack_fffffffffffffed0)),
                       in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                       (int)in_stack_fffffffffffffec0,
                       (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                       (BarcodeFormat)in_stack_fffffffffffffeb8,si,in_stack_fffffffffffffee8,
                       (bool)cVar2);
        Error::~Error((Error *)0x28952f);
      }
    }
    else {
      in_RDI->_format = None;
      in_RDI->_ecLevel[0] = '\0';
      in_RDI->_ecLevel[1] = '\0';
      in_RDI->_ecLevel[2] = '\0';
      in_RDI->_ecLevel[3] = '\0';
      in_RDI->_version[0] = '\0';
      in_RDI->_version[1] = '\0';
      in_RDI->_version[2] = '\0';
      in_RDI->_version[3] = '\0';
      in_RDI->_lineCount = 0;
      (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
      *(undefined8 *)&(in_RDI->_sai).id = 0;
      (in_RDI->_sai).id._M_string_length = 0;
      *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
      (in_RDI->_sai).index = 0;
      (in_RDI->_sai).count = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
      *(undefined8 *)&in_RDI->_readerOpts = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
      (in_RDI->_error)._line = 0;
      (in_RDI->_error)._type = None;
      *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
      *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
      (in_RDI->_error)._file = (char *)0x0;
      (in_RDI->_error)._msg._M_string_length = 0;
      (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
      (in_RDI->_content).symbology.code = '\0';
      (in_RDI->_content).symbology.modifier = '\0';
      (in_RDI->_content).symbology.eciModifierOffset = '\0';
      (in_RDI->_content).symbology.aiFlag = None;
      (in_RDI->_content).defaultCharset = Unknown;
      (in_RDI->_content).hasECI = false;
      *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
      *(undefined8 *)&(in_RDI->_error)._msg = 0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      in_RDI->_isMirrored = false;
      in_RDI->_isInverted = false;
      in_RDI->_readerInit = false;
      *(undefined5 *)&in_RDI->field_0xd3 = 0;
      Result::Result(in_stack_fffffffffffffe80);
    }
LAB_0028955f:
    local_88 = 1;
    std::__cxx11::string::~string(local_78);
  }
  else {
    memset(in_RDI,0,0xd8);
    Result::Result(in_stack_fffffffffffffe80);
  }
  return in_RDI;
}

Assistant:

Barcode CodabarReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>&) const
{
	// minimal number of characters that must be present (including start, stop and checksum characters)
	// absolute minimum would be 2 (meaning 0 'content'). everything below 4 produces too many false
	// positives.
	const int minCharCount = 4;
	auto isStartOrStopSymbol = [](char c) { return 'A' <= c && c <= 'D'; };

	next = FindLeftGuard<CHAR_LEN>(next, minCharCount * CHAR_LEN, IsLeftGuard);
	if (!next.isValid())
		return {};

	int xStart = next.pixelsInFront();
	int maxInterCharacterSpace = next.sum() / 2; // spec actually says 1 narrow space, width/2 is about 4

	std::string txt;
	txt.reserve(20);
	txt += DecodeNarrowWidePattern(next, CHARACTER_ENCODINGS, ALPHABET); // read off the start pattern

	if (!isStartOrStopSymbol(txt.back()))
		return {};

	do {
		// check remaining input width and inter-character space
		if (!next.skipSymbol() || !next.skipSingle(maxInterCharacterSpace))
			return {};

		txt += DecodeNarrowWidePattern(next, CHARACTER_ENCODINGS, ALPHABET);
		if (txt.back() == 0)
			return {};
	} while (!isStartOrStopSymbol(txt.back()));

	// next now points to the last decoded symbol
	// check txt length and whitespace after the last char. See also FindStartPattern.
	if (Size(txt) < minCharCount || !next.hasQuietZoneAfter(QUIET_ZONE_SCALE))
		return {};

	// remove stop/start characters
	if (!_opts.returnCodabarStartEnd())
		txt = txt.substr(1, txt.size() - 2);

	// symbology identifier ISO/IEC 15424:2008 4.4.9
	// if checksum processing were implemented and checksum present and stripped then modifier would be 4
	SymbologyIdentifier symbologyIdentifier = {'F', '0'};

	int xStop = next.pixelsTillEnd();
	return Barcode(txt, rowNumber, xStart, xStop, BarcodeFormat::Codabar, symbologyIdentifier);
}